

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O0

bool CheckTxScripts(CTransaction *tx,
                   map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                   *map_prevout_scriptPubKeys,
                   map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                   *map_prevout_values,uint flags,PrecomputedTransactionData *txdata,string *strTest
                   ,bool expect_valid)

{
  bool bVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  mapped_type *witness;
  undefined4 in_ECX;
  long in_FS_OFFSET;
  byte in_stack_00000008;
  uint i;
  bool tx_valid;
  CAmount amount;
  ScriptError err;
  CTxIn input;
  CTxIn *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  MissingDataBehavior in_stack_fffffffffffffbb4;
  undefined7 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbf;
  CAmount *in_stack_fffffffffffffbc0;
  key_type *in_stack_fffffffffffffbc8;
  CTransaction *in_stack_fffffffffffffbd0;
  const_string *msg;
  CTxIn *in_stack_fffffffffffffbd8;
  const_string *in_stack_fffffffffffffbe0;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffbe8;
  unit_test_log_t *this;
  ScriptError *serror;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 uVar5;
  uint flags_00;
  CScript *scriptPubKey;
  CScript *in_stack_fffffffffffffc78;
  bool local_361;
  uint local_350;
  bool local_34a;
  const_string local_310;
  lazy_ostream local_300 [2];
  assertion_result local_2e0;
  const_string local_2a8;
  lazy_ostream local_298;
  ScriptError in_stack_fffffffffffffd7c;
  assertion_result local_278;
  unit_test_log_t local_250 [2];
  const_string local_240;
  lazy_ostream local_230 [2];
  assertion_result local_210 [2];
  const_string local_1d8;
  lazy_ostream local_1c8 [2];
  assertion_result local_1a8 [9];
  CScript *local_c0;
  uint local_b4;
  undefined1 local_48 [40];
  ScriptError local_20 [6];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = (bool)(in_stack_00000008 & 1);
  local_34a = true;
  local_b4 = (uint)(bVar1 != false);
  local_350 = 0;
  while( true ) {
    sVar3 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffba8);
    local_361 = false;
    if (local_350 < sVar3) {
      local_361 = local_34a;
    }
    if (local_361 == false) break;
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)
               CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
               CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    CTxIn::CTxIn(in_stack_fffffffffffffbd8,(CTxIn *)in_stack_fffffffffffffbd0);
    sVar4 = std::
            map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
            ::count((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                     *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                    (key_type *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0));
    if (sVar4 == 0) {
      scriptPubKey = (CScript *)0x0;
      uVar5 = in_ECX;
    }
    else {
      in_stack_fffffffffffffc78 =
           (CScript *)
           std::
           map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
           ::at((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                 *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
      scriptPubKey = (CScript *)
                     (in_stack_fffffffffffffc78->super_CScriptBase)._union.indirect_contents.
                     indirect;
      uVar5 = in_ECX;
    }
    flags_00 = (uint)((ulong)local_48 >> 0x20);
    local_c0 = scriptPubKey;
    witness = std::
              map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
              ::at((map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                    *)in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    serror = local_20;
    in_ECX = uVar5;
    GenericTransactionSignatureChecker<CTransaction>::GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CTransaction> *)in_stack_fffffffffffffbd8,
               in_stack_fffffffffffffbd0,(uint)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
               in_stack_fffffffffffffbc0,
               (PrecomputedTransactionData *)
               CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
               in_stack_fffffffffffffbb4);
    local_34a = VerifyScript(in_stack_fffffffffffffc78,scriptPubKey,(CScriptWitness *)witness,
                             flags_00,(BaseSignatureChecker *)
                                      CONCAT44(uVar5,in_stack_fffffffffffffc58),serror);
    GenericTransactionSignatureChecker<CTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CTransaction> *)in_stack_fffffffffffffba8);
    if (bVar1 != false) {
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                   (pointer)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   (unsigned_long)in_stack_fffffffffffffba8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffba8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                   (size_t)in_stack_fffffffffffffbd8,(const_string *)in_stack_fffffffffffffbd0);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8)
                   ,SUB41(in_stack_fffffffffffffbb4 >> 0x18,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffba8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                   (pointer)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   (unsigned_long)in_stack_fffffffffffffba8);
        in_stack_fffffffffffffba8 = (CTxIn *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_1a8,local_1c8,&local_1d8,0x88,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffffba8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffba8);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                   (pointer)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   (unsigned_long)in_stack_fffffffffffffba8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffba8);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe0,
                   (size_t)in_stack_fffffffffffffbd8,(const_string *)in_stack_fffffffffffffbd0);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8)
                   ,SUB41(in_stack_fffffffffffffbb4 >> 0x18,0));
        boost::unit_test::lazy_ostream::instance();
        ScriptErrorString_abi_cxx11_(in_stack_fffffffffffffd7c);
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffba8);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)
                   CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                   (pointer)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                   (unsigned_long)in_stack_fffffffffffffba8);
        in_stack_fffffffffffffba8 = (CTxIn *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_210,local_230,&local_240,0x89,CHECK);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)in_stack_fffffffffffffba8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffba8);
        boost::test_tools::assertion_result::~assertion_result
                  ((assertion_result *)in_stack_fffffffffffffba8);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
      local_b4 = 1;
    }
    CTxIn::~CTxIn(in_stack_fffffffffffffba8);
    local_350 = local_350 + 1;
  }
  if (bVar1 == false) {
    do {
      this = local_250;
      file = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                 (pointer)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 (unsigned_long)in_stack_fffffffffffffba8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffba8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (this,file,(size_t)in_stack_fffffffffffffbd8,
                 (const_string *)in_stack_fffffffffffffbd0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                 SUB41(in_stack_fffffffffffffbb4 >> 0x18,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffba8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                 (pointer)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 (unsigned_long)in_stack_fffffffffffffba8);
      in_stack_fffffffffffffba8 = (CTxIn *)0x0;
      boost::test_tools::tt_detail::report_assertion(&local_278,&local_298,&local_2a8,0x8e,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffffba8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffba8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                 (pointer)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 (unsigned_long)in_stack_fffffffffffffba8);
      msg = (const_string *)&stack0xfffffffffffffd38;
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffba8);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (this,file,(size_t)in_stack_fffffffffffffbd8,msg);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                 SUB41(in_stack_fffffffffffffbb4 >> 0x18,0));
      in_stack_fffffffffffffbd8 = (CTxIn *)boost::unit_test::lazy_ostream::instance();
      ScriptErrorString_abi_cxx11_(in_stack_fffffffffffffd7c);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffba8);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                 (pointer)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                 (unsigned_long)in_stack_fffffffffffffba8);
      in_stack_fffffffffffffba8 = (CTxIn *)0x0;
      boost::test_tools::tt_detail::report_assertion(&local_2e0,local_300,&local_310,0x8f,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffffba8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffba8);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffba8);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_34a == bVar1;
}

Assistant:

bool CheckTxScripts(const CTransaction& tx, const std::map<COutPoint, CScript>& map_prevout_scriptPubKeys,
    const std::map<COutPoint, int64_t>& map_prevout_values, unsigned int flags,
    const PrecomputedTransactionData& txdata, const std::string& strTest, bool expect_valid)
{
    bool tx_valid = true;
    ScriptError err = expect_valid ? SCRIPT_ERR_UNKNOWN_ERROR : SCRIPT_ERR_OK;
    for (unsigned int i = 0; i < tx.vin.size() && tx_valid; ++i) {
        const CTxIn input = tx.vin[i];
        const CAmount amount = map_prevout_values.count(input.prevout) ? map_prevout_values.at(input.prevout) : 0;
        try {
            tx_valid = VerifyScript(input.scriptSig, map_prevout_scriptPubKeys.at(input.prevout),
                &input.scriptWitness, flags, TransactionSignatureChecker(&tx, i, amount, txdata, MissingDataBehavior::ASSERT_FAIL), &err);
        } catch (...) {
            BOOST_ERROR("Bad test: " << strTest);
            return true; // The test format is bad and an error is thrown. Return true to silence further error.
        }
        if (expect_valid) {
            BOOST_CHECK_MESSAGE(tx_valid, strTest);
            BOOST_CHECK_MESSAGE((err == SCRIPT_ERR_OK), ScriptErrorString(err));
            err = SCRIPT_ERR_UNKNOWN_ERROR;
        }
    }
    if (!expect_valid) {
        BOOST_CHECK_MESSAGE(!tx_valid, strTest);
        BOOST_CHECK_MESSAGE((err != SCRIPT_ERR_OK), ScriptErrorString(err));
    }
    return (tx_valid == expect_valid);
}